

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cc
# Opt level: O1

Int ipx::FindMaxAbs(Vector *x)

{
  double dVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  double dVar5;
  
  if (x->_M_size != 0) {
    dVar5 = 0.0;
    sVar4 = 0;
    sVar3 = 0;
    do {
      dVar1 = ABS(x->_M_data[sVar4]);
      sVar2 = sVar4;
      if (ABS(x->_M_data[sVar4]) <= dVar5) {
        dVar1 = dVar5;
        sVar2 = sVar3;
      }
      sVar3 = sVar2;
      dVar5 = dVar1;
      sVar4 = sVar4 + 1;
    } while (x->_M_size != sVar4);
    return (Int)sVar3;
  }
  return 0;
}

Assistant:

Int FindMaxAbs(const Vector& x) {
    double xmax = 0.0;
    size_t imax = 0;
    for (size_t i = 0; i < x.size(); i++) {
        if (std::abs(x[i]) > xmax) {
            xmax = std::abs(x[i]);
            imax = i;
        }
    }
    return static_cast<Int>(imax);
}